

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O1

void Addr_ESI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  UInt32 *pUVar1;
  int iVar2;
  long lVar3;
  Int64 IVar4;
  size_t sVar5;
  ulong uVar6;
  char (*pacVar7) [8];
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pMyOperand->OpMnemonic[2] = '\0';
    pMyOperand->OpMnemonic[0] = '(';
    pMyOperand->OpMnemonic[1] = '%';
    lVar3 = 2;
  }
  else {
    lVar3 = 0;
  }
  pMyOperand->OpType = 0x30000;
  iVar2 = (pMyDisasm->Reserved_).AddressSize;
  if (iVar2 == 0x20) {
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      pacVar7 = Registers32Bits + 0xe;
      goto LAB_0013d588;
    }
    pacVar7 = Registers32Bits + 6;
LAB_0013d60e:
    strcpy(pMyOperand->OpMnemonic + lVar3,*pacVar7);
    IVar4 = REGS[6];
  }
  else {
    if (iVar2 != 0x40) {
      pUVar1 = &(pMyDisasm->Reserved_).DECALAGE_EIP;
      *pUVar1 = *pUVar1 + 2;
      uVar6 = (pMyDisasm->Reserved_).EndOfBlock;
      if ((uVar6 != 0) && (uVar6 < (pMyDisasm->Reserved_).EIP_ + 4)) {
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      uVar6 = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 2);
      (pMyOperand->Memory).Displacement = uVar6;
      CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + lVar3,"%.4X",uVar6);
      goto LAB_0013d621;
    }
    if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
      pacVar7 = (char (*) [8])(Registers64Bits + 6);
      goto LAB_0013d60e;
    }
    pacVar7 = (char (*) [8])(Registers64Bits + 0xe);
LAB_0013d588:
    strcpy(pMyOperand->OpMnemonic + lVar3,*pacVar7);
    IVar4 = REGS[0xe];
  }
  (pMyOperand->Memory).BaseRegister = IVar4;
LAB_0013d621:
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar5 = strlen(pMyOperand->OpMnemonic);
    (pMyOperand->OpMnemonic + sVar5)[0] = ')';
    (pMyOperand->OpMnemonic + sVar5)[1] = '\0';
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ESI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    long MyNumber;
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
     #endif
    pMyOperand->OpType = MEMORY_TYPE;
    if (GV.AddressSize == 64) {
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else if (GV.AddressSize == 32) {

        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else {
        GV.DECALAGE_EIP+=2;
        if (!Security(4, pMyDisasm)) return;
        MyNumber = *((UInt16*) (GV.EIP_+2));
        pMyOperand->Memory.Displacement = MyNumber;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+i,"%.4X", (Int64)MyNumber);
        #endif
    }
    #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
    }
  #endif
}